

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_command.cpp
# Opt level: O0

void __thiscall duckdb::UnzipCommand::ExecuteInternal(UnzipCommand *this,ExecuteContext *context)

{
  bool bVar1;
  undefined8 uVar2;
  type pFVar3;
  pointer pcVar4;
  long lVar5;
  long in_RDI;
  int64_t bytes_read;
  unique_ptr<char[],_std::default_delete<char[]>_> compressed_buffer;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> output_file;
  FileOpenFlags out_flags;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
  compressed_file_handle;
  FileOpenFlags in_flags;
  VirtualFileSystem vfs;
  char *in_stack_fffffffffffffdc8;
  type in_stack_fffffffffffffdd0;
  int local_1d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  undefined1 uVar6;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [32];
  optional_ptr<duckdb::FileOpener,_true> local_170;
  idx_t local_168;
  FileLockType FStack_160;
  FileCompressionType FStack_15f;
  undefined6 uStack_15e;
  undefined1 local_158 [8];
  FileOpenFlags local_150;
  undefined1 local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [32];
  optional_ptr<duckdb::FileOpener,_true> local_f0;
  idx_t local_e8;
  FileLockType FStack_e0;
  FileCompressionType FStack_df;
  undefined6 uStack_de;
  undefined1 local_d0 [24];
  FileOpenFlags local_b8;
  VirtualFileSystem local_a0 [160];
  
  duckdb::VirtualFileSystem::VirtualFileSystem(local_a0);
  local_b8.flags = FileFlags::FILE_FLAGS_READ;
  local_b8.lock = (FileLockType)std::__cxx11::string::back;
  local_b8.compression = std::__cxx11::string::back_1;
  local_b8._10_6_ = uRam0000000000a255fa;
  FileOpenFlags::SetCompression(&local_b8,GZIP);
  local_e8 = local_b8.flags;
  FStack_e0 = local_b8.lock;
  FStack_df = local_b8.compression;
  uStack_de = local_b8._10_6_;
  optional_ptr<duckdb::FileOpener,_true>::optional_ptr(&local_f0,(FileOpener *)0x0);
  duckdb::FileSystem::OpenFile(local_d0,local_a0,in_RDI + 0x90,local_e8,_FStack_e0,local_f0.ptr);
  bVar1 = std::operator==((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>
                           *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  if (bVar1) {
    local_139 = 1;
    uVar2 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"Cannot open the file \"%s\"",&local_111);
    std::__cxx11::string::string(local_138,(string *)(in_RDI + 0x90));
    CatalogException::CatalogException<std::__cxx11::string>
              ((CatalogException *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    local_139 = 0;
    __cxa_throw(uVar2,&CatalogException::typeinfo,CatalogException::~CatalogException);
  }
  FileOpenFlags::FileOpenFlags(&local_150,10);
  local_168 = local_150.flags;
  FStack_160 = local_150.lock;
  FStack_15f = local_150.compression;
  uStack_15e = local_150._10_6_;
  optional_ptr<duckdb::FileOpener,_true>::optional_ptr(&local_170,(FileOpener *)0x0);
  duckdb::FileSystem::OpenFile(local_158,local_a0,in_RDI + 0xb0,local_168,_FStack_160,local_170.ptr)
  ;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_> *)
                     0x7beefb);
  if (bVar1) {
    do {
      operator_new__(0x100000);
      std::unique_ptr<char[],std::default_delete<char[]>>::
      unique_ptr<char*,std::default_delete<char[]>,void,bool>
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_fffffffffffffdd0,
                 in_stack_fffffffffffffdc8);
      pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator*((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                          *)in_stack_fffffffffffffdd0);
      pcVar4 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                         ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                          in_stack_fffffffffffffdd0);
      lVar5 = duckdb::VirtualFileSystem::Read((FileHandle *)local_a0,pFVar3,(long)pcVar4);
      if (lVar5 == 0) {
        local_1d4 = 3;
      }
      else {
        in_stack_fffffffffffffdd0 =
             unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator*((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                        *)in_stack_fffffffffffffdd0);
        pcVar4 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                           ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                            in_stack_fffffffffffffdd0);
        duckdb::VirtualFileSystem::Write
                  ((FileHandle *)local_a0,in_stack_fffffffffffffdd0,(long)pcVar4);
        local_1d4 = 0;
      }
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_fffffffffffffdd0);
    } while (local_1d4 == 0);
    unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::~unique_ptr
              ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *)
               0x7bf15a);
    unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::~unique_ptr
              ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *)
               0x7bf167);
    VirtualFileSystem::~VirtualFileSystem((VirtualFileSystem *)in_stack_fffffffffffffdd0);
    return;
  }
  uVar6 = 1;
  uVar2 = __cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"Cannot open the file \"%s\"",&local_191);
  std::__cxx11::string::string(local_1b8,(string *)(in_RDI + 0xb0));
  CatalogException::CatalogException<std::__cxx11::string>
            ((CatalogException *)CONCAT17(uVar6,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38
             ,in_stack_fffffffffffffe30);
  __cxa_throw(uVar2,&CatalogException::typeinfo,CatalogException::~CatalogException);
}

Assistant:

void UnzipCommand::ExecuteInternal(ExecuteContext &context) const {
	VirtualFileSystem vfs;

	// input
	FileOpenFlags in_flags(FileFlags::FILE_FLAGS_READ);
	in_flags.SetCompression(FileCompressionType::GZIP);
	auto compressed_file_handle = vfs.OpenFile(input_path, in_flags);
	if (compressed_file_handle == nullptr) {
		throw CatalogException("Cannot open the file \"%s\"", input_path);
	}

	// output
	FileOpenFlags out_flags(FileOpenFlags::FILE_FLAGS_FILE_CREATE | FileOpenFlags::FILE_FLAGS_WRITE);
	auto output_file = vfs.OpenFile(extraction_path, out_flags);
	if (!output_file) {
		throw CatalogException("Cannot open the file \"%s\"", extraction_path);
	}

	// read the compressed data from the file
	while (true) {
		std::unique_ptr<char[]> compressed_buffer(new char[BUFFER_SIZE]);
		int64_t bytes_read = vfs.Read(*compressed_file_handle, compressed_buffer.get(), BUFFER_SIZE);
		if (bytes_read == 0) {
			break;
		}

		vfs.Write(*output_file, compressed_buffer.get(), bytes_read);
	}
}